

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O2

CopyablePtr<perfetto::protos::gen::IPCFrame_InvokeMethod> * __thiscall
protozero::CopyablePtr<perfetto::protos::gen::IPCFrame_InvokeMethod>::operator=
          (CopyablePtr<perfetto::protos::gen::IPCFrame_InvokeMethod> *this,
          CopyablePtr<perfetto::protos::gen::IPCFrame_InvokeMethod> *other)

{
  _Head_base<0UL,_perfetto::protos::gen::IPCFrame_InvokeMethod_*,_false> _Var1;
  _Head_base<0UL,_perfetto::protos::gen::IPCFrame_InvokeMethod_*,_false> this_00;
  
  perfetto::std::
  __uniq_ptr_impl<perfetto::protos::gen::IPCFrame_InvokeMethod,_std::default_delete<perfetto::protos::gen::IPCFrame_InvokeMethod>_>
  ::operator=((__uniq_ptr_impl<perfetto::protos::gen::IPCFrame_InvokeMethod,_std::default_delete<perfetto::protos::gen::IPCFrame_InvokeMethod>_>
               *)this,(__uniq_ptr_impl<perfetto::protos::gen::IPCFrame_InvokeMethod,_std::default_delete<perfetto::protos::gen::IPCFrame_InvokeMethod>_>
                       *)other);
  this_00._M_head_impl = (IPCFrame_InvokeMethod *)operator_new(0x60);
  perfetto::protos::gen::IPCFrame_InvokeMethod::IPCFrame_InvokeMethod(this_00._M_head_impl);
  _Var1._M_head_impl =
       (other->ptr_)._M_t.
       super___uniq_ptr_impl<perfetto::protos::gen::IPCFrame_InvokeMethod,_std::default_delete<perfetto::protos::gen::IPCFrame_InvokeMethod>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::protos::gen::IPCFrame_InvokeMethod_*,_std::default_delete<perfetto::protos::gen::IPCFrame_InvokeMethod>_>
       .super__Head_base<0UL,_perfetto::protos::gen::IPCFrame_InvokeMethod_*,_false>._M_head_impl;
  (other->ptr_)._M_t.
  super___uniq_ptr_impl<perfetto::protos::gen::IPCFrame_InvokeMethod,_std::default_delete<perfetto::protos::gen::IPCFrame_InvokeMethod>_>
  ._M_t.
  super__Tuple_impl<0UL,_perfetto::protos::gen::IPCFrame_InvokeMethod_*,_std::default_delete<perfetto::protos::gen::IPCFrame_InvokeMethod>_>
  .super__Head_base<0UL,_perfetto::protos::gen::IPCFrame_InvokeMethod_*,_false>._M_head_impl =
       this_00._M_head_impl;
  if (_Var1._M_head_impl != (IPCFrame_InvokeMethod *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_CppMessageObj + 8))();
  }
  return this;
}

Assistant:

CopyablePtr& operator=(CopyablePtr&& other) {
    ptr_ = std::move(other.ptr_);
    other.ptr_.reset(new T());
    return *this;
  }